

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
::erase(DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
        *this,CancellationDelegate **Val)

{
  bool bVar1;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *ConstFoundBucket;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *local_10;
  
  bVar1 = DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
          ::LookupBucketFor<llbuild::core::CancellationDelegate*>
                    ((DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
                      *)this,Val,&local_10);
  if (bVar1) {
    local_10->key = (CancellationDelegate *)0xfffffffffffffff0;
    *(int *)(this + 8) = *(int *)(this + 8) + -1;
    *(int *)(this + 0xc) = *(int *)(this + 0xc) + 1;
  }
  return bVar1;
}

Assistant:

bool erase(const KeyT &Val) {
    BucketT *TheBucket;
    if (!LookupBucketFor(Val, TheBucket))
      return false; // not in map.

    TheBucket->getSecond().~ValueT();
    TheBucket->getFirst() = getTombstoneKey();
    decrementNumEntries();
    incrementNumTombstones();
    return true;
  }